

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u32 count)

{
  ulong uVar1;
  ulong uVar2;
  Result RVar3;
  u32 uVar4;
  bool bVar5;
  
  uVar2 = (ulong)count;
  uVar1 = (this->type_).limits.max;
  bVar5 = uVar1 - uVar2 < (ulong)this->pages_;
  if (!bVar5 && uVar1 >= uVar2) {
    uVar4 = this->pages_ + count;
    this->pages_ = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(ulong)(uVar4 * 0x10000));
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar5 || uVar1 < uVar2;
  return (Result)RVar3.enum_;
}

Assistant:

Result Memory::Grow(u32 count) {
  u32 new_pages;
  if (CanGrow(type_.limits, pages_, count, &new_pages)) {
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
    return Result::Ok;
  }
  return Result::Error;
}